

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O0

int inet_pton4(char *src,uchar *dst)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  uchar *puVar4;
  uint nw;
  char *pch;
  uchar *tp;
  uchar tmp [4];
  int ch;
  int octets;
  int saw_digit;
  uchar *dst_local;
  char *src_local;
  
  bVar1 = false;
  tmp[0] = '\0';
  tmp[1] = '\0';
  tmp[2] = '\0';
  tmp[3] = '\0';
  tp._0_4_ = (uint)tp & 0xffffff00;
  pch = (char *)&tp;
  dst_local = (uchar *)src;
  while( true ) {
    while( true ) {
      puVar4 = dst_local + 1;
      tp._4_4_ = (int)(char)*dst_local;
      if (tp._4_4_ == 0) {
        if ((int)tmp < 4) {
          src_local._4_4_ = -0x16;
        }
        else {
          *(uint *)dst = (uint)tp;
          src_local._4_4_ = 0;
        }
        return src_local._4_4_;
      }
      pcVar3 = strchr("0123456789",tp._4_4_);
      dst_local = puVar4;
      if (pcVar3 == (char *)0x0) break;
      uVar2 = (uint)(byte)*pch * 10 + (int)pcVar3 + -0x12d1bc;
      if ((bVar1) && (*pch == '\0')) {
        return -0x16;
      }
      if (0xff < uVar2) {
        return -0x16;
      }
      *pch = (char)uVar2;
      if (!bVar1) {
        tmp = (uchar  [4])((int)tmp + 1);
        if (4 < (int)tmp) {
          return -0x16;
        }
        bVar1 = true;
      }
    }
    if ((tp._4_4_ != 0x2e) || (!bVar1)) break;
    if (tmp == (uchar  [4])0x4) {
      return -0x16;
    }
    pch[1] = '\0';
    bVar1 = false;
    pch = pch + 1;
  }
  return -0x16;
}

Assistant:

static int inet_pton4(const char *src, unsigned char *dst) {
  static const char digits[] = "0123456789";
  int saw_digit, octets, ch;
  unsigned char tmp[sizeof(struct in_addr)], *tp;

  saw_digit = 0;
  octets = 0;
  *(tp = tmp) = 0;
  while ((ch = *src++) != '\0') {
    const char *pch;

    if ((pch = strchr(digits, ch)) != NULL) {
      unsigned int nw = *tp * 10 + (pch - digits);

      if (saw_digit && *tp == 0)
        return UV_EINVAL;
      if (nw > 255)
        return UV_EINVAL;
      *tp = nw;
      if (!saw_digit) {
        if (++octets > 4)
          return UV_EINVAL;
        saw_digit = 1;
      }
    } else if (ch == '.' && saw_digit) {
      if (octets == 4)
        return UV_EINVAL;
      *++tp = 0;
      saw_digit = 0;
    } else
      return UV_EINVAL;
  }
  if (octets < 4)
    return UV_EINVAL;
  memcpy(dst, tmp, sizeof(struct in_addr));
  return 0;
}